

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  _Setprecision _Var2;
  _Setw _Var3;
  ostream *poVar4;
  ostream *poVar5;
  int passed;
  exception *e;
  uint in_stack_0000016c;
  uint *in_stack_00000170;
  uint codepoint;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Test UTF-8");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"- From UTF-8");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Correct");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Too big");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Invalid length");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  make2(0x80);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make2(0x7ff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0x800);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0xffff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x10000);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x10ffff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x110000);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x1fffff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make2(0);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make2(0x7f);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0x7f);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x7f);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0x80);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x80);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0x7ff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x7ff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0x8000);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0xffff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Invalid surrogate");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  make3(0xd800);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0xdbff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0xdc00);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make3(0xdfff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0xd800);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0xdbff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0xdc00);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  make4(0xdfff);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Incomplete");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  test_to<char>((char *)in_stack_00000170,in_stack_0000016c);
  poVar5 = std::operator<<((ostream *)&std::cout,"- To UTF-8");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  codepoint = (uint)((ulong)poVar5 >> 0x20);
  poVar5 = std::operator<<((ostream *)&std::cout,"-- Test correct");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  test_from<char>((char *)poVar4,codepoint);
  test_from<char>((char *)poVar4,codepoint);
  test_from<char>((char *)poVar4,codepoint);
  test_from<char>((char *)poVar4,codepoint);
  test_from<char>((char *)poVar4,codepoint);
  test_from<char>((char *)poVar4,codepoint);
  test_from<char>((char *)poVar4,codepoint);
  poVar4 = std::operator<<((ostream *)&std::cout,"Test UTF-16");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"- From UTF-16");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Correct");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u16_seq(0x10);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xffff);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xd800,0xdc00);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xdbff,0xdfff);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Invalid surrogate");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u16_seq(0xdfff);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xdc00);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Incomplete");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u16_seq(0);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xd800);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xdbff);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"- To UTF-16");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Test correct");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u16_seq(0x10);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xffff);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xd800,0xdc00);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  u16_seq(0xdbff,0xdfff);
  test_to<unsigned_short>((unsigned_short *)in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"Test UTF-32");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"- From UTF-32");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Correct");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u32_seq(0x10);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0xffff);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0x10000);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0x10ffff);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Invalid surrogate");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u32_seq(0xd800);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0xdbff);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0xdfff);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0xdc00);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0x110000);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Incomplete");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u32_seq(0);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  poVar4 = std::operator<<((ostream *)&std::cout,"- To UTF-32");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"-- Test correct");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  u32_seq(0x10);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0xffff);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  u32_seq(0x10ffff);
  test_to<unsigned_int>(in_stack_00000170,in_stack_0000016c);
  iVar1 = test_counter - error_counter;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4," tests");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (0 < error_counter) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,error_counter);
    poVar4 = std::operator<<(poVar4," tests");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
  _Var2 = std::setprecision(1);
  poVar4 = std::operator<<(poVar4,_Var2);
  _Var3 = std::setw(5);
  poVar4 = std::operator<<(poVar4,_Var3);
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,((double)iVar1 * 100.0) / (double)test_counter);
  poVar4 = std::operator<<(poVar4,"% of tests completed sucsessefully");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return (uint)(error_counter != 0);
}

Assistant:

int main()
{
    try {

        std::cout << "Test UTF-8" << std::endl;
        std::cout << "- From UTF-8" << std::endl;


        std::cout << "-- Correct" << std::endl;

        test_to("\x7f",0x7f);
        test_to("\xc2\x80",0x80);
        test_to("\xdf\xbf",0x7ff);
        test_to("\xe0\xa0\x80",0x800);
        test_to("\xef\xbf\xbf",0xffff);
        test_to("\xf0\x90\x80\x80",0x10000);
        test_to("\xf4\x8f\xbf\xbf",0x10ffff);

        std::cout << "-- Too big" << std::endl;
        test_to("\xf4\x9f\x80\x80",illegal); //  11 0000
        test_to("\xfb\xbf\xbf\xbf",illegal); // 3ff ffff
        test_to("\xf8\x90\x80\x80\x80",illegal);  // 400 0000
        test_to("\xfd\xbf\xbf\xbf\xbf\xbf",illegal);  // 7fff ffff

        std::cout << "-- Invalid length" << std::endl;

        /// test that this actually works
        test_to(make2(0x80),0x80);
        test_to(make2(0x7ff),0x7ff);

        test_to(make3(0x800),0x800);
        test_to(make3(0xffff),0xffff);

        test_to(make4(0x10000),0x10000);
        test_to(make4(0x10ffff),0x10ffff);

        test_to(make4(0x110000),illegal);
        test_to(make4(0x1fffff),illegal);
        
        test_to(make2(0),illegal);
        test_to(make3(0),illegal);
        test_to(make4(0),illegal);
        test_to(make2(0x7f),illegal);
        test_to(make3(0x7f),illegal);
        test_to(make4(0x7f),illegal);

        test_to(make3(0x80),illegal);
        test_to(make4(0x80),illegal);
        test_to(make3(0x7ff),illegal);
        test_to(make4(0x7ff),illegal);

        test_to(make4(0x8000),illegal);
        test_to(make4(0xffff),illegal);
        
        std::cout << "-- Invalid surrogate" << std::endl;
        
        test_to(make3(0xd800),illegal);
        test_to(make3(0xdbff),illegal);
        test_to(make3(0xdc00),illegal);
        test_to(make3(0xdfff),illegal);

        test_to(make4(0xd800),illegal);
        test_to(make4(0xdbff),illegal);
        test_to(make4(0xdc00),illegal);
        test_to(make4(0xdfff),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        test_to("",incomplete);

        test_to("\x80",illegal);
        test_to("\xc2",incomplete);
        
        test_to("\xdf",incomplete);

        test_to("\xe0",incomplete);
        test_to("\xe0\xa0",incomplete);

        test_to("\xef\xbf",incomplete);
        test_to("\xef",incomplete);

        test_to("\xf0\x90\x80",incomplete);
        test_to("\xf0\x90",incomplete);
        test_to("\xf0",incomplete);

        test_to("\xf4\x8f\xbf",incomplete);
        test_to("\xf4\x8f",incomplete);
        test_to("\xf4",incomplete);

        std::cout << "- To UTF-8" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        test_from("\x7f",0x7f);
        test_from("\xc2\x80",0x80);
        test_from("\xdf\xbf",0x7ff);
        test_from("\xe0\xa0\x80",0x800);
        test_from("\xef\xbf\xbf",0xffff);
        test_from("\xf0\x90\x80\x80",0x10000);
        test_from("\xf4\x8f\xbf\xbf",0x10ffff);

        std::cout << "Test UTF-16" << std::endl;
        std::cout << "- From UTF-16" << std::endl;


        std::cout << "-- Correct" << std::endl;

        test_to(u16_seq(0x10),0x10);
        test_to(u16_seq(0xffff),0xffff);
        test_to(u16_seq(0xD800,0xDC00),0x10000);
        test_to(u16_seq(0xDBFF,0xDFFF),0x10FFFF);


        std::cout << "-- Invalid surrogate" << std::endl;
        
        test_to(u16_seq(0xDFFF),illegal);
        test_to(u16_seq(0xDC00),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        test_to(u16_seq(0),incomplete);
        test_to(u16_seq(0xD800),incomplete);
        test_to(u16_seq(0xDBFF),incomplete);

        std::cout << "- To UTF-16" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        test_to(u16_seq(0x10),0x10);
        test_to(u16_seq(0xffff),0xffff);
        test_to(u16_seq(0xD800,0xDC00),0x10000);
        test_to(u16_seq(0xDBFF,0xDFFF),0x10FFFF);


        std::cout << "Test UTF-32" << std::endl;
        std::cout << "- From UTF-32" << std::endl;


        std::cout << "-- Correct" << std::endl;

        test_to(u32_seq(0x10),0x10);
        test_to(u32_seq(0xffff),0xffff);
        test_to(u32_seq(0x10000),0x10000);
        test_to(u32_seq(0x10ffff),0x10ffff);



        std::cout << "-- Invalid surrogate" << std::endl;
        
        test_to(u32_seq(0xD800),illegal);
        test_to(u32_seq(0xDBFF),illegal);
        test_to(u32_seq(0xDFFF),illegal);
        test_to(u32_seq(0xDC00),illegal);
        test_to(u32_seq(0x110000),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        test_to(u32_seq(0),incomplete);

        std::cout << "- To UTF-32" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        test_to(u32_seq(0x10),0x10);
        test_to(u32_seq(0xffff),0xffff);
        test_to(u32_seq(0x10ffff),0x10ffff);



    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
}